

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall indk::Neuron::setLambda(Neuron *this,float _l)

{
  pointer ppVar1;
  pointer pcVar2;
  pointer ppVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  E;
  long *local_48 [2];
  long local_38 [2];
  Entry *local_28;
  
  ppVar3 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar1) {
    do {
      pcVar2 = (ppVar3->first)._M_dataplus._M_p;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,pcVar2,pcVar2 + (ppVar3->first)._M_string_length);
      local_28 = ppVar3->second;
      Entry::setLambda(local_28,_l);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  return;
}

Assistant:

void indk::Neuron::setLambda(float _l) {
    for (auto E: Entries) E.second -> setLambda(_l);
}